

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int modify_field(void *basep,field_s *field,char *data)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  int val;
  float fval;
  int local_48;
  uint local_44;
  char *local_40;
  float local_34;
  
  if (1 < g_debug) {
    fprintf(_stderr,"+d modifying field \'%s\' with \'%s\'\n",field->name,data);
  }
  if ((data == (char *)0x0) || (sVar2 = strlen(data), sVar2 == 0)) {
    pcVar3 = "** no data for \'%s\' field modification\n";
LAB_0010cf91:
    fprintf(_stderr,pcVar3,field->name);
LAB_0010cf9b:
    iVar1 = 1;
  }
  else {
    iVar1 = field->type;
    iVar6 = (int)sVar2;
    if (iVar1 < 8) {
      if (iVar1 == -0xfff) {
        pcVar3 = (char *)((long)basep + (long)field->offset);
        strncpy(pcVar3,data,(long)field->len);
        iVar1 = field->len - iVar6;
        if (iVar1 != 0 && iVar6 <= field->len) {
          memset(pcVar3 + iVar6,0,(long)iVar1);
          return 0;
        }
      }
      else {
        if (iVar1 != 4) {
LAB_0010cfe6:
          pcVar3 = "** refusing to modify a pointer field, \'%s\'\n";
          goto LAB_0010cf91;
        }
        if (0 < field->len) {
          local_40 = field->name;
          uVar7 = 0;
LAB_0010cd86:
          iVar1 = __isoc99_sscanf(data," %d%n",&local_44,&local_48);
          if (iVar1 == 1) {
            if ((int)(short)local_44 == local_44) goto code_r0x0010cdb8;
            uVar4 = 0x8000;
            uVar5 = 0x7fff;
LAB_0010d045:
            fprintf(_stderr,"** mod val #%d (= %d) outside byte range [-%d,%d]\n",uVar7 & 0xffffffff
                    ,(ulong)local_44,uVar4,uVar5);
          }
          else {
LAB_0010cfc6:
            fprintf(_stderr,"** found %d of %d modify values\n",uVar7 & 0xffffffff,
                    (ulong)(uint)field->len);
          }
          goto LAB_0010cf9b;
        }
      }
    }
    else if (iVar1 == 8) {
      if (0 < field->len) {
        local_40 = field->name;
        uVar7 = 0;
        do {
          iVar1 = __isoc99_sscanf(data," %d%n",&local_44,&local_48);
          if (iVar1 != 1) goto LAB_0010cfc6;
          *(uint *)((long)basep + uVar7 * 4 + (long)field->offset) = local_44;
          if (1 < g_debug) {
            fprintf(_stderr,"+d setting posn %d of \'%s\' to %d\n",uVar7 & 0xffffffff,local_40);
          }
          data = data + local_48;
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)field->len);
      }
    }
    else if (iVar1 == 0x10) {
      if (0 < field->len) {
        local_40 = field->name;
        uVar7 = 0;
        do {
          iVar1 = __isoc99_sscanf(data," %f%n",&local_34,&local_48);
          if (iVar1 != 1) goto LAB_0010cfc6;
          *(float *)((long)basep + uVar7 * 4 + (long)field->offset) = local_34;
          if (1 < g_debug) {
            fprintf(_stderr,"+d setting posn %d of \'%s\' to %f\n",(double)local_34,
                    uVar7 & 0xffffffff,local_40);
          }
          data = data + local_48;
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)field->len);
      }
    }
    else {
      if (iVar1 != 0x100) goto LAB_0010cfe6;
      if (0 < field->len) {
        local_40 = field->name;
        uVar7 = 0;
        do {
          iVar1 = __isoc99_sscanf(data," %d%n",&local_44,&local_48);
          if (iVar1 != 1) goto LAB_0010cfc6;
          if ((int)(char)local_44 != local_44) {
            uVar4 = 0x80;
            uVar5 = 0x7f;
            goto LAB_0010d045;
          }
          *(char *)((long)basep + uVar7 + (long)field->offset) = (char)local_44;
          if (1 < g_debug) {
            fprintf(_stderr,"+d setting posn %d of \'%s\' to %d\n",uVar7 & 0xffffffff,local_40);
          }
          data = data + local_48;
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)field->len);
      }
    }
LAB_0010cf69:
    iVar1 = 0;
  }
  return iVar1;
code_r0x0010cdb8:
  *(short *)((long)basep + uVar7 * 2 + (long)field->offset) = (short)local_44;
  if (1 < g_debug) {
    fprintf(_stderr,"+d setting posn %d of \'%s\' to %d\n",uVar7 & 0xffffffff,local_40);
  }
  data = data + local_48;
  uVar7 = uVar7 + 1;
  if ((long)field->len <= (long)uVar7) goto LAB_0010cf69;
  goto LAB_0010cd86;
}

Assistant:

int modify_field(void * basep, field_s * field, char * data)
{
   float   fval;
   char  * posn = data;
   int     val, max, fc, nchars;

   if( g_debug > 1 )
      fprintf(stderr,"+d modifying field '%s' with '%s'\n", field->name, data);

   if( !data || strlen(data) == 0 )
   {
      fprintf(stderr,"** no data for '%s' field modification\n",field->name);
      return 1;
   }

   switch( field->type )
   {
         case DT_UNKNOWN:
         case NT_DT_POINTER:
         case NT_DT_CHAR_PTR:
         case NT_DT_EXT_PTR:
         default:
            fprintf(stderr,"** refusing to modify a pointer field, '%s'\n",
                    field->name);
            return 1;

         case DT_INT8:
         {
            max = 127;
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %d%n", &val, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               if( val > max || val < -(max+1) )
               {
                  fprintf(stderr,
                    "** mod val #%d (= %d) outside byte range [-%d,%d]\n",
                    fc, val, max+1, max);
                  return 1;
               }
               /* otherwise, we're good */
               (((char *)basep + field->offset))[fc] = (char)val;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %d\n",
                          fc, field->name, val);
               posn += nchars;
            }
         }
         break;

         case DT_INT16:
         {
            max = 32767;
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %d%n", &val, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               if( val > max || val < -(max+1) )
               {
                  fprintf(stderr,
                    "** mod val #%d (= %d) outside byte range [-%d,%d]\n",
                    fc, val, max+1, max);
                  return 1;
               }
               /* otherwise, we're good */
               ((short *)((char *)basep + field->offset))[fc] = (short)val;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %d\n",
                          fc, field->name, val);
               posn += nchars;
            }
         }
         break;

         case DT_INT32:
         {
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %d%n", &val, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               ((int *)((char *)basep + field->offset))[fc] = val;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %d\n",
                          fc, field->name, val);
               posn += nchars;
            }
         }
         break;

         case DT_FLOAT32:
         {
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %f%n", &fval, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               /* otherwise, we're good */
               ((float *)((char *)basep + field->offset))[fc] = fval;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %f\n",
                          fc, field->name, fval);
               posn += nchars;
            }
         }
         break;

         case NT_DT_STRING:
         {
            char * dest = (char *)basep + field->offset;
            nchars = strlen(data);
            strncpy(dest, data, field->len);
            if( nchars < field->len )  /* clear the rest */
               memset(dest+nchars, '\0', field->len-nchars);
         }
         break;
   }

   return 0;
}